

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_6d7a8::ParserImpl::ParseExpList(ParserImpl *this)

{
  TokenDetail op;
  int iVar1;
  __uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> _Var2;
  ParserImpl *in_RSI;
  long *local_70;
  Lexer *local_68;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_60;
  String *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aaStack_40 [2];
  
  local_60 = (anon_union_8_2_010d16d7_for_TokenDetail_0)this;
  _Var2.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
  super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
  super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl =
       (__uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>)operator_new(0x28)
  ;
  if ((in_RSI->look_ahead_).token_ == 0x11e) {
    luna::Lexer::GetToken(in_RSI->lexer_,&in_RSI->look_ahead_);
  }
  iVar1 = (in_RSI->look_ahead_).line_;
  *(undefined ***)
   _Var2.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
   super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
   super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl = &PTR__ExpressionList_00154658;
  *(undefined8 *)
   ((long)_Var2.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t
          .super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
          super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)_Var2.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t
          .super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
          super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 *)
   ((long)_Var2.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t
          .super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
          super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 0x18) = 0;
  *(int *)((long)_Var2.
                 super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
                 super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 0x20) = iVar1;
  while( true ) {
    local_70 = (long *)0x0;
    local_58 = (String *)0x0;
    uStack_50._0_4_ = 0;
    uStack_50._4_4_ = 0;
    local_48._0_4_ = 0;
    local_48._4_4_ = 0;
    aaStack_40[0]._0_4_ = 0x11e;
    op._28_4_ = aaStack_40[0]._4_4_;
    op.token_ = 0x11e;
    op.line_ = 0;
    op.column_ = 0;
    op.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
    op.module_ = (String *)0x0;
    ParseExp((ParserImpl *)&local_68,
             (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,op,
             (int)&local_70);
    std::
    vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
    ::emplace_back<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>
              ((vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
                *)((long)_Var2.
                         super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                         .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 8),
               (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)&local_68);
    if (local_68 != (Lexer *)0x0) {
      (*(code *)(local_68->state_->string_pool_)._M_t.
                super___uniq_ptr_impl<luna::StringPool,_std::default_delete<luna::StringPool>_>._M_t
                .super__Tuple_impl<0UL,_luna::StringPool_*,_std::default_delete<luna::StringPool>_>.
                super__Head_base<0UL,_luna::StringPool_*,_false>._M_head_impl)();
    }
    local_68 = (Lexer *)0x0;
    if (local_70 != (long *)0x0) {
      (**(code **)(*local_70 + 8))();
    }
    local_70 = (long *)0x0;
    iVar1 = (in_RSI->look_ahead_).token_;
    if (iVar1 == 0x11e) {
      luna::Lexer::GetToken(in_RSI->lexer_,&in_RSI->look_ahead_);
      iVar1 = (in_RSI->look_ahead_).token_;
    }
    if (iVar1 != 0x2c) break;
    NextToken(in_RSI);
  }
  ((local_60.str_)->super_GCObject)._vptr_GCObject =
       (_func_int **)
       _Var2.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
       super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
       super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
         _Var2.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
         super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseExpList()
        {
            std::unique_ptr<ExpressionList> exp_list(new ExpressionList(LookAhead().line_));

            bool anymore = true;
            while (anymore)
            {
                exp_list->exp_list_.push_back(ParseExp());

                if (LookAhead().token_ == ',')
                    NextToken();
                else
                    anymore = false;
            }

            return std::move(exp_list);
        }